

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O0

void __thiscall Pl_Flate::checkError(Pl_Flate *this,char *prefix,int error_code)

{
  void *pvVar1;
  pointer pMVar2;
  runtime_error *this_00;
  char *local_178;
  string local_168;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string msg;
  char *action_str;
  z_stream *zstream;
  int error_code_local;
  char *prefix_local;
  Pl_Flate *this_local;
  
  pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::operator->
                     (&this->m);
  pvVar1 = pMVar2->zdata;
  if (error_code == 0) {
    return;
  }
  pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::operator->
                     (&this->m);
  if (pMVar2->action == a_deflate) {
    local_178 = "deflate";
  }
  else {
    local_178 = "inflate";
  }
  msg.field_2._8_8_ = local_178;
  std::operator+(&local_d0,&(this->super_Pipeline).identifier,": ");
  std::operator+(&local_b0,&local_d0,(char *)msg.field_2._8_8_);
  std::operator+(&local_90,&local_b0,": ");
  std::operator+(&local_70,&local_90,prefix);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70,": ");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (*(long *)((long)pvVar1 + 0x30) == 0) {
    switch(error_code) {
    case -6:
      std::__cxx11::string::operator+=((string *)local_50,"zlib version error");
      break;
    case -5:
      std::__cxx11::string::operator+=((string *)local_50,"zlib buffer error");
      break;
    case -4:
      std::__cxx11::string::operator+=((string *)local_50,"zlib memory error");
      break;
    case -3:
      std::__cxx11::string::operator+=((string *)local_50,"zlib data error");
      break;
    case -2:
      std::__cxx11::string::operator+=((string *)local_50,"zlib stream error");
      break;
    case -1:
      std::__cxx11::string::operator+=((string *)local_50,"zlib system error");
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"zlib unknown error (",&local_141);
      std::__cxx11::to_string(&local_168,error_code);
      std::operator+(&local_120,&local_140,&local_168);
      std::operator+(&local_100,&local_120,")");
      std::__cxx11::string::operator+=((string *)local_50,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)local_50,*(char **)((long)pvVar1 + 0x30));
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
Pl_Flate::checkError(char const* prefix, int error_code)
{
    z_stream& zstream = *(static_cast<z_stream*>(m->zdata));
    if (error_code != Z_OK) {
        char const* action_str = (m->action == a_deflate ? "deflate" : "inflate");
        std::string msg = this->identifier + ": " + action_str + ": " + prefix + ": ";

        if (zstream.msg) {
            msg += zstream.msg;
        } else {
            switch (error_code) {
            case Z_ERRNO:
                msg += "zlib system error";
                break;

            case Z_STREAM_ERROR:
                msg += "zlib stream error";
                break;

            case Z_DATA_ERROR:
                msg += "zlib data error";
                break;

            case Z_MEM_ERROR:
                msg += "zlib memory error";
                break;

            case Z_BUF_ERROR:
                msg += "zlib buffer error";
                break;

            case Z_VERSION_ERROR:
                msg += "zlib version error";
                break;

            default:
                msg += std::string("zlib unknown error (") + std::to_string(error_code) + ")";
                break;
            }
        }

        throw std::runtime_error(msg);
    }
}